

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(uint value)

{
  size_t extraout_RDX;
  undefined4 in_register_0000003c;
  SimpleString *hexString;
  SimpleString SVar1;
  SimpleString local_28;
  SimpleString *pSStack_10;
  uint value_local;
  
  hexString = (SimpleString *)CONCAT44(in_register_0000003c,value);
  pSStack_10 = hexString;
  HexStringFrom((uint)&local_28);
  BracketsFormattedHexString(hexString);
  SimpleString::~SimpleString(&local_28);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)hexString;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(unsigned int value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}